

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonAST.hpp
# Opt level: O0

void __thiscall antlr::CommonAST::CommonAST(CommonAST *this,CommonAST *other)

{
  long in_RSI;
  BaseAST *in_RDI;
  BaseAST *unaff_retaddr;
  
  BaseAST::BaseAST(unaff_retaddr,in_RDI);
  (in_RDI->super_AST)._vptr_AST = (_func_int **)&PTR__CommonAST_004e6d18;
  *(undefined4 *)&in_RDI[1].super_AST._vptr_AST = *(undefined4 *)(in_RSI + 0x20);
  std::__cxx11::string::string((string *)&in_RDI[1].super_AST.ref,(string *)(in_RSI + 0x28));
  return;
}

Assistant:

CommonAST( const CommonAST& other )
	: BaseAST(other)
	, ttype(other.ttype)
	, text(other.text)
	{
	}